

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

void pop_container(mu_Context *ctx)

{
  mu_Container *pmVar1;
  mu_Layout *pmVar2;
  mu_Layout *layout;
  mu_Container *cnt;
  mu_Context *ctx_local;
  
  pmVar1 = mu_get_current_container(ctx);
  pmVar2 = get_layout(ctx);
  (pmVar1->content_size).x = (pmVar2->max).x - (pmVar2->body).x;
  (pmVar1->content_size).y = (pmVar2->max).y - (pmVar2->body).y;
  if ((ctx->container_stack).idx < 1) {
    fprintf(_stderr,"Fatal error: %s:%d: assertion \'%s\' failed\n",
            "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/microui/microui.c"
            ,0x12a,"(ctx->container_stack).idx > 0");
    abort();
  }
  (ctx->container_stack).idx = (ctx->container_stack).idx + -1;
  if ((ctx->layout_stack).idx < 1) {
    fprintf(_stderr,"Fatal error: %s:%d: assertion \'%s\' failed\n",
            "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/microui/microui.c"
            ,299,"(ctx->layout_stack).idx > 0");
    abort();
  }
  (ctx->layout_stack).idx = (ctx->layout_stack).idx + -1;
  mu_pop_id(ctx);
  return;
}

Assistant:

static void pop_container(mu_Context *ctx) {
  mu_Container *cnt = mu_get_current_container(ctx);
  mu_Layout *layout = get_layout(ctx);
  cnt->content_size.x = layout->max.x - layout->body.x;
  cnt->content_size.y = layout->max.y - layout->body.y;
  /* pop container, layout and id */
  pop(ctx->container_stack);
  pop(ctx->layout_stack);
  mu_pop_id(ctx);
}